

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O0

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  ulong uVar1;
  uchar *in_RCX;
  ulong in_RSI;
  size_t in_R8;
  size_t i;
  size_t in_stack_00000038;
  size_t in_stack_00000040;
  size_t in_stack_00000048;
  uchar *in_stack_00000050;
  size_t in_stack_ffffffffffffffc8;
  
  for (uVar1 = in_RSI >> 1; uVar1 != 0; uVar1 = uVar1 - 1) {
    heap_down(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
              (_func_int_void_ptr_void_ptr_void_ptr *)ptr,(void *)count);
  }
  for (; 1 < in_RSI; in_RSI = in_RSI - 1) {
    heap_swap(in_RCX,in_R8,in_RSI,in_stack_ffffffffffffffc8);
    heap_down(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
              (_func_int_void_ptr_void_ptr_void_ptr *)ptr,(void *)count);
  }
  return;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data ) {
    size_t i;

    for(i = count/2; 0 < i; --i) {
        heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for(i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}